

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

NodeIterator
Indexing::RetrievalAlgorithms::
__selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>
          (IntermediateNode *n,RobSubstitution *subs,uint normInternalBank)

{
  SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  i1;
  bool bVar1;
  long lVar2;
  long *in_RSI;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  *in_RDI;
  Top TVar3;
  Node **match;
  Top top;
  uint specVar;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  *this;
  IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined4 uVar5;
  uint in_stack_ffffffffffffff98;
  undefined4 uVar6;
  uint in_stack_ffffffffffffff9c;
  undefined4 uVar7;
  RobSubstitution *in_stack_ffffffffffffffa0;
  undefined4 local_38;
  
  this = in_RDI;
  TVar3 = Kernel::RobSubstitution::getSpecialVarTop
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  local_38 = CONCAT31(local_38._1_3_,TVar3._inner._inner._content[7]);
  Kernel::TermList::Top::var((Top *)this);
  bVar1 = Lib::Option::operator_cast_to_bool((Option<Kernel::VarNumber> *)0xad71d1);
  Lib::Option<Kernel::VarNumber>::~Option((Option<Kernel::VarNumber> *)0xad71e4);
  if (bVar1) {
    (**(code **)(*in_RSI + 0x40))(in_RDI);
  }
  else {
    uVar4 = TVar3._inner._inner._0_4_;
    uVar5 = TVar3._inner._inner._content._3_4_;
    lVar2 = (**(code **)(*in_RSI + 0x50))
                      (in_RSI,TVar3._inner._inner._0_8_,TVar3._inner._inner._content[7],0);
    uVar6 = (undefined4)lVar2;
    uVar7 = (undefined4)((ulong)lVar2 >> 0x20);
    if (lVar2 == 0) {
      (**(code **)(*in_RSI + 0x48))(in_RDI);
    }
    else {
      Lib::
      getSingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>
                ((Node **)0xad7296);
      (**(code **)(*in_RSI + 0x48))();
      i1._4_4_ = local_38;
      i1._0_4_ = uVar5;
      i1._el._0_4_ = uVar6;
      i1._el._4_4_ = uVar7;
      Lib::
      concatIters<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>,Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>
                (i1,(VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
                     *)CONCAT44(uVar4,in_stack_ffffffffffffff88));
      Lib::
      pvi<Lib::IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>>>>
                (in_stack_ffffffffffffff68);
      Lib::
      IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
      ::~IterTraits((IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
                     *)0xad72ed);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
      ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
                          *)in_RDI);
    }
  }
  return (NodeIterator)this;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator __selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, RobSubstitution& subs, unsigned normInternalBank)
      {
        unsigned specVar=n->childVar;
        auto top = subs.getSpecialVarTop(specVar, normInternalBank);
        if(top.var()) {
          return n->allChildren();
        } else {
          auto** match = n->childByTop(top, /* canCreate */ false);
          if(match) {
            return pvi(concatIters(
                         getSingletonIterator(match),
                         n->variableChildren()));
          } else {
            return n->variableChildren();
          }
        }
      }